

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

FunctionMatch * __thiscall
Jinx::Impl::Parser::CheckFunctionCall
          (FunctionMatch *__return_storage_ptr__,Parser *this,bool skipInitialParam,
          SymbolListCItr currSym,SymbolListCItr endSym)

{
  element_type *this_00;
  undefined8 this_01;
  undefined8 uVar1;
  uint uVar2;
  bool bVar3;
  SymbolListCItr SVar4;
  char *format;
  LogLevel level;
  pointer name;
  FunctionMatch match;
  LibraryIPtr library;
  FunctionMatch newMatch;
  String libraryName;
  element_type *local_118;
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  _Stack_110;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  pointer ptStack_c8;
  SymbolListCItr local_c0;
  uint local_b4;
  LibraryIPtr local_b0;
  LibraryIPtr local_a0;
  LibraryIPtr local_90;
  LibraryIPtr local_80;
  pointer local_70;
  String local_68;
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  local_48;
  
  _Stack_110._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_110._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118 = (element_type *)0x0;
  _Stack_110._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if ((this->m_error == false) &&
     ((this->m_symbolList->
      super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
      super__Vector_impl_data._M_finish != currSym._M_current)) {
    bVar3 = IsOperator((currSym._M_current)->type);
    if ((!bVar3) || ((currSym._M_current)->type == ParenOpen)) {
      CheckLibraryName_abi_cxx11_(&local_68,this);
      if ((local_68._M_string_length == 0) ||
         (currSym._M_current = currSym._M_current + 1,
         currSym._M_current !=
         (this->m_symbolList->
         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
         super__Vector_impl_data._M_finish)) {
        if (local_68._M_string_length == 0) {
          CheckFunctionCall((FunctionMatch *)local_e0,this,&this->m_localFunctions,currSym,endSym,
                            skipInitialParam);
          uVar1 = local_e0._0_8_;
          local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
               _Stack_110._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_48._M_impl.super__Vector_impl_data._M_finish =
               _Stack_110._M_impl.super__Vector_impl_data._M_finish;
          local_48._M_impl.super__Vector_impl_data._M_start =
               _Stack_110._M_impl.super__Vector_impl_data._M_start;
          local_118 = (element_type *)local_e0._0_8_;
          _Stack_110._M_impl.super__Vector_impl_data._M_start = (pointer)local_e0._8_8_;
          _Stack_110._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d0._M_pi;
          _Stack_110._M_impl.super__Vector_impl_data._M_end_of_storage = ptStack_c8;
          local_e0._8_8_ = (element_type *)0x0;
          local_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ptStack_c8 = (pointer)0x0;
          std::
          _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::~_Vector_base(&local_48);
          std::
          _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::~_Vector_base((_Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                           *)(local_e0 + 8));
          if ((element_type *)uVar1 == (element_type *)0x0) {
            local_90.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (this->m_library).
                 super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_90.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (this->m_library).
                     super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi;
            if (local_90.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_90.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_90.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_90.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_90.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            CheckFunctionCall((FunctionMatch *)local_e0,this,&local_90,currSym,endSym,
                              skipInitialParam);
            uVar1 = local_e0._0_8_;
            local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
                 _Stack_110._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_48._M_impl.super__Vector_impl_data._M_finish =
                 _Stack_110._M_impl.super__Vector_impl_data._M_finish;
            local_48._M_impl.super__Vector_impl_data._M_start =
                 _Stack_110._M_impl.super__Vector_impl_data._M_start;
            local_118 = (element_type *)local_e0._0_8_;
            _Stack_110._M_impl.super__Vector_impl_data._M_start = (pointer)local_e0._8_8_;
            _Stack_110._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d0._M_pi;
            _Stack_110._M_impl.super__Vector_impl_data._M_end_of_storage = ptStack_c8;
            local_e0._8_8_ = (element_type *)0x0;
            local_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            ptStack_c8 = (pointer)0x0;
            std::
            _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
            ::~_Vector_base(&local_48);
            std::
            _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
            ::~_Vector_base((_Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                             *)(local_e0 + 8));
            if (local_90.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_90.
                         super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((element_type *)uVar1 == (element_type *)0x0) {
              Runtime::GetLibraryInternal
                        ((Runtime *)local_f0,
                         (String *)
                         (this->m_runtime).
                         super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ;
              local_a0.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_f0._0_8_;
              local_a0.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_;
              if ((element_type *)local_f0._8_8_ != (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_f0._8_8_ + 8))->
                           _M_weak_this).
                           super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                   (local_f0._8_8_ + 8))->_M_weak_this).
                                  super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_f0._8_8_ + 8))->
                           _M_weak_this).
                           super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                   (local_f0._8_8_ + 8))->_M_weak_this).
                                  super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 1;
                }
              }
              CheckFunctionCall((FunctionMatch *)local_e0,this,&local_a0,currSym,endSym,
                                skipInitialParam);
              local_118 = (element_type *)local_e0._0_8_;
              local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
                   _Stack_110._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_48._M_impl.super__Vector_impl_data._M_finish =
                   _Stack_110._M_impl.super__Vector_impl_data._M_finish;
              local_48._M_impl.super__Vector_impl_data._M_start =
                   _Stack_110._M_impl.super__Vector_impl_data._M_start;
              _Stack_110._M_impl.super__Vector_impl_data._M_start = (pointer)local_e0._8_8_;
              _Stack_110._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d0._M_pi;
              _Stack_110._M_impl.super__Vector_impl_data._M_end_of_storage = ptStack_c8;
              local_e0._8_8_ = (element_type *)0x0;
              local_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              ptStack_c8 = (pointer)0x0;
              std::
              _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              ::~_Vector_base(&local_48);
              std::
              _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              ::~_Vector_base((_Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                               *)(local_e0 + 8));
              if ((element_type *)
                  local_a0.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (element_type *)0x0) {
                Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a0.
                           super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              this_00 = (element_type *)local_f0._8_8_;
              if (local_118 == (element_type *)0x0) {
                name = (this->m_importList).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                local_70 = (this->m_importList).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                uVar2 = (uint)skipInitialParam;
                if (name != local_70) {
                  do {
                    local_b4 = uVar2;
                    bVar3 = Runtime::LibraryExists
                                      ((this->m_runtime).
                                       super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,name);
                    if (!bVar3) {
                      LogWriteLine(Warning,"Unable to find library \'%s\'",(name->_M_dataplus)._M_p)
                      ;
                      (__return_storage_ptr__->partData).
                      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      (__return_storage_ptr__->partData).
                      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      __return_storage_ptr__->signature = (FunctionSignature *)0x0;
                      (__return_storage_ptr__->partData).
                      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_001ffe62:
                      if ((element_type *)local_f0._8_8_ != (element_type *)0x0) {
                        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
                      }
                      goto LAB_001ffafe;
                    }
                    Runtime::GetLibrary((Runtime *)local_e0,
                                        (String *)
                                        (this->m_runtime).
                                        super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr);
                    uVar1 = local_e0._8_8_;
                    if ((element_type *)local_e0._8_8_ != (element_type *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                  (local_e0._8_8_ + 8))->_M_weak_this).
                                 super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr =
                             *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                       (local_e0._8_8_ + 8))->_M_weak_this).
                                      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 1;
                        UNLOCK();
                      }
                      else {
                        *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                  (local_e0._8_8_ + 8))->_M_weak_this).
                                 super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr =
                             *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                       (local_e0._8_8_ + 8))->_M_weak_this).
                                      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 1;
                      }
                    }
                    SVar4._M_current = (Symbol *)local_e0._0_8_;
                    if ((element_type *)local_e0._8_8_ != (element_type *)0x0) {
                      local_c0._M_current = (Symbol *)local_e0._0_8_;
                      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
                      SVar4._M_current = local_c0._M_current;
                    }
                    this_01 = local_f0._8_8_;
                    local_f0._8_8_ = uVar1;
                    local_f0._0_8_ = SVar4._M_current;
                    if ((element_type *)this_01 != (element_type *)0x0) {
                      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
                    }
                    local_b0.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)local_f0._0_8_;
                    local_b0.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_;
                    if ((element_type *)local_f0._8_8_ != (element_type *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                  (local_f0._8_8_ + 8))->_M_weak_this).
                                 super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr =
                             *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                       (local_f0._8_8_ + 8))->_M_weak_this).
                                      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 1;
                        UNLOCK();
                      }
                      else {
                        *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                  (local_f0._8_8_ + 8))->_M_weak_this).
                                 super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr =
                             *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)
                                       (local_f0._8_8_ + 8))->_M_weak_this).
                                      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 1;
                      }
                    }
                    CheckFunctionCall((FunctionMatch *)local_e0,this,&local_b0,currSym,endSym,
                                      SUB41(local_b4,0));
                    if ((element_type *)
                        local_b0.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (element_type *)0x0) {
                      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_b0.
                                 super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                    uVar1 = local_e0._0_8_;
                    if ((element_type *)local_e0._0_8_ != (element_type *)0x0) {
                      if (local_118 == (element_type *)0x0) {
                        local_118 = (element_type *)local_e0._0_8_;
                        std::
                        vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                        ::operator=((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                     *)&_Stack_110,
                                    (vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                     *)(local_e0 + 8));
                        if ((((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar1 + 0x410))->
                             _M_use_count != 1) ||
                           ((element_type *)local_f0._0_8_ ==
                            (this->m_library).
                            super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)) goto LAB_001ffde9;
                        level = Error;
                        format = "Unable to call library function with private scope.";
                      }
                      else {
                        level = Warning;
                        format = 
                        "Ambiguous function name detected.  Use library name to disambiguate.";
                      }
                      LogWriteLine(level,format);
                      (__return_storage_ptr__->partData).
                      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      (__return_storage_ptr__->partData).
                      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      __return_storage_ptr__->signature = (FunctionSignature *)0x0;
                      (__return_storage_ptr__->partData).
                      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      std::
                      _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                      ::~_Vector_base((_Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                       *)(local_e0 + 8));
                      goto LAB_001ffe62;
                    }
LAB_001ffde9:
                    std::
                    _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                    ::~_Vector_base((_Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                     *)(local_e0 + 8));
                    name = name + 1;
                    uVar2 = local_b4;
                    this_00 = (element_type *)local_f0._8_8_;
                  } while (name != local_70);
                }
              }
              goto joined_r0x001ffc96;
            }
          }
        }
        else {
          local_c0._M_current = endSym._M_current;
          Runtime::GetLibrary((Runtime *)local_e0,
                              (String *)
                              (this->m_runtime).
                              super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
          this_00 = (element_type *)local_e0._8_8_;
          local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_e0._0_8_;
          if ((element_type *)local_e0._8_8_ != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_e0._8_8_ + 8))->
                       _M_weak_this).
                       super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_e0._8_8_ + 8))
                            ->_M_weak_this).
                            super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_e0._8_8_ + 8))->
                       _M_weak_this).
                       super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)(local_e0._8_8_ + 8))
                            ->_M_weak_this).
                            super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
            }
          }
          if ((element_type *)local_e0._8_8_ != (element_type *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
          }
          local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
          if (this_00 != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)((long)this_00 + 8))->
                       _M_weak_this).
                       super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)((long)this_00 + 8))->
                            _M_weak_this).
                            super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)((long)this_00 + 8))->
                       _M_weak_this).
                       super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<Jinx::Impl::Runtime> *)((long)this_00 + 8))->
                            _M_weak_this).
                            super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
            }
          }
          CheckFunctionCall((FunctionMatch *)local_e0,this,&local_80,currSym,local_c0,
                            skipInitialParam);
          local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
               _Stack_110._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_48._M_impl.super__Vector_impl_data._M_finish =
               _Stack_110._M_impl.super__Vector_impl_data._M_finish;
          local_48._M_impl.super__Vector_impl_data._M_start =
               _Stack_110._M_impl.super__Vector_impl_data._M_start;
          _Stack_110._M_impl.super__Vector_impl_data._M_start = (pointer)local_e0._8_8_;
          _Stack_110._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d0._M_pi;
          _Stack_110._M_impl.super__Vector_impl_data._M_end_of_storage = ptStack_c8;
          local_e0._8_8_ = (element_type *)0x0;
          local_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ptStack_c8 = (pointer)0x0;
          std::
          _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::~_Vector_base(&local_48);
          std::
          _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::~_Vector_base((_Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                           *)(local_e0 + 8));
          local_118 = (element_type *)local_e0._0_8_;
          if ((element_type *)
              local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (element_type *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_80.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
joined_r0x001ffc96:
          if (this_00 != (element_type *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          }
        }
      }
      __return_storage_ptr__->signature = (FunctionSignature *)local_118;
      (__return_storage_ptr__->partData).
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           _Stack_110._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->partData).
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           _Stack_110._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->partData).
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           _Stack_110._M_impl.super__Vector_impl_data._M_end_of_storage;
      _Stack_110._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      _Stack_110._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      _Stack_110._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_001ffafe:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        MemFree(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001ff8f0;
    }
    __return_storage_ptr__->signature = (FunctionSignature *)0x0;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = _Stack_110._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         _Stack_110._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         _Stack_110._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    __return_storage_ptr__->signature = (FunctionSignature *)0x0;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  _Stack_110._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_110._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_110._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_001ff8f0:
  std::
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ::~_Vector_base(&_Stack_110);
  return __return_storage_ptr__;
}

Assistant:

inline_t Parser::FunctionMatch Parser::CheckFunctionCall(bool skipInitialParam, SymbolListCItr currSym, SymbolListCItr endSym) const
	{
		FunctionMatch match;

		// Store current symbol
		auto currentSymbol = currSym;

		// Check for error or invalid symbols
		if (m_error || currentSymbol == m_symbolList.end())
			return match;

		// Any operators other than open parentheses mean this can't be a function call
		if (IsOperator(currentSymbol->type) && (currentSymbol->type != SymbolType::ParenOpen))
			return match;

		// Check for explicit library name in the first symbol.  libraryName is empty if not found.
		String libraryName = CheckLibraryName();

		// Advance the current symbol if we found a valid library name
		if (!libraryName.empty())
		{
			++currentSymbol;
			if (currentSymbol == m_symbolList.end())
				return match;
		}

		// If we explicitly specify a library name, then only look in that library
		if (!libraryName.empty())
		{
			auto library = m_runtime->GetLibraryInternal(libraryName);
			match = CheckFunctionCall(library, currentSymbol, endSym, skipInitialParam);
		}
		else
		{
			// Check local function table for signature match
			match = CheckFunctionCall(m_localFunctions, currentSymbol, endSym, skipInitialParam);

			// If not found in local function table, search in libraries for a function match
			if (!match.signature)
			{
				// Check the current library for a signature match
				match = CheckFunctionCall(m_library, currentSymbol, endSym, skipInitialParam);

				// If a library name isn't specified or a signature wasn't found, search first in current library, then in order of imports
				if (!match.signature)
				{
					// Search default library first
					auto library = m_runtime->GetLibraryInternal(libraryName);
					match = CheckFunctionCall(library, currentSymbol, endSym, skipInitialParam);

					// If function wasn't found in default library, search through all import libraries
					if (!match.signature)
					{
						// Loop through all imported library names
						for (const auto & libName : m_importList)
						{
							// Make sure the library exists
							if (!m_runtime->LibraryExists(libName))
							{
								LogWriteLine(LogLevel::Warning, "Unable to find library '%s'", libName.c_str());
								return FunctionMatch();
							}

							// Search for function in this library
							library = m_runtime->GetLibraryInternal(libName);
							auto newMatch = CheckFunctionCall(library, currentSymbol, endSym, skipInitialParam);
							if (newMatch.signature)
							{
								if (match.signature)
								{
									LogWriteLine(LogLevel::Warning, "Ambiguous function name detected.  Use library name to disambiguate.");
									return FunctionMatch();
								}
								else
								{
									match = newMatch;
									if (match.signature->GetVisibility() == VisibilityType::Private && library != m_library)
									{
										LogWriteLine(LogLevel::Error, "Unable to call library function with private scope.");
										return FunctionMatch();
									}
								}
							}
						}
					}
				}
			}
		}

		return match;
	}